

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdServer.hpp
# Opt level: O1

void __thiscall Statsd::StatsdServer::~StatsdServer(StatsdServer *this)

{
  pointer pcVar1;
  
  if (this->m_socket != -1) {
    close(this->m_socket);
  }
  pcVar1 = (this->m_errorMessage)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_errorMessage).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~StatsdServer() {
        if (detail::isValidSocket(m_socket)) {
            SOCKET_CLOSE(m_socket);
        }
    }